

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O3

void __thiscall
CTestResource_Test2DTileYResourceMips_Test::TestBody
          (CTestResource_Test2DTileYResourceMips_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  uint32_t ExpectedValue;
  bool bVar1;
  int iVar2;
  GMM_RESOURCE_INFO *ResourceInfo;
  int iVar3;
  GMM_RESOURCE_INFO *pGVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  undefined4 uStack_168;
  undefined4 uStack_164;
  GMM_RESCREATE_PARAMS gmmParams;
  uint local_d0;
  int local_cc;
  uint32_t HeightOfPrevMipsInTile;
  ulong uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  unsigned_long local_98;
  uint auStack_90 [11];
  uint32_t local_64;
  uint32_t SizeOfMip0;
  uint local_54;
  uint32_t MipOffset;
  internal local_48 [8];
  AssertionResult gtest_ar;
  
  uVar9 = 0;
  do {
    gmmParams.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
    gmmParams.pExistingSysMem = 0;
    gmmParams.MaxLod = 0;
    gmmParams.ArraySize = 0;
    gmmParams.MaximumRenamingListLength = 0;
    gmmParams.NoGfxMemory = '\0';
    gmmParams._109_3_ = 0;
    gmmParams.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
    gmmParams.BaseAlignment = 0;
    gmmParams.OverridePitch = 0;
    gmmParams.RotateInfo = 0;
    gmmParams._84_4_ = 0;
    gmmParams.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
    gmmParams.MSAA.SamplePattern = GMM_MSAA_DISABLED;
    gmmParams.MSAA.NumSamples = 0;
    gmmParams.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
    gmmParams.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x1000000000;
    gmmParams.ExistingSysMemSize = 0x100000000;
    gmmParams.Type = RESOURCE_INVALID;
    gmmParams.Format = GMM_FORMAT_A4P4_UNORM_PALETTE1;
    gmmParams.CpTag = 0x200;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth64 = 0x200;
    gmmParams.BaseHeight = 9;
    gmmParams.Depth = 0;
    local_cc = (&DAT_001a8580)[uVar9];
    _uStack_168 = CONCAT44((&DAT_001a85f0)[uVar9],2);
    _SizeOfMip0 = (GMM_RESOURCE_INFO *)
                  (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                            (CommonULT::pGmmULTClientContext,&uStack_168);
    uStack_c0 = 0;
    auStack_90[6] = 0;
    auStack_90[7] = 0;
    auStack_90[8] = 0;
    auStack_90[9] = 0;
    auStack_90[2] = 0;
    auStack_90[3] = 0;
    auStack_90[4] = 0;
    auStack_90[5] = 0;
    local_98 = 0;
    auStack_90[0] = 0;
    auStack_90[1] = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    _HeightOfPrevMipsInTile = 1;
    (**(code **)(*(long *)_SizeOfMip0 + 0x68))(_SizeOfMip0,&HeightOfPrevMipsInTile);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_48,"0","OffsetInfo.Render.Offset64",(int *)&gtest_ar.message_,&local_98);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x406,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.XOffset",(int *)&gtest_ar.message_,auStack_90);
    iVar7 = local_cc;
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x407,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.YOffset",(int *)&gtest_ar.message_,auStack_90 + 1);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x408,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.ZOffset",(int *)&gtest_ar.message_,auStack_90 + 2);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x409,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_b8 = 0;
    uStack_b0 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    auStack_90[0] = 0;
    auStack_90[1] = 0;
    auStack_90[2] = 0;
    auStack_90[3] = 0;
    auStack_90[4] = 0;
    auStack_90[5] = 0;
    auStack_90[6] = 0;
    auStack_90[7] = 0;
    auStack_90[8] = 0;
    auStack_90[9] = 0;
    _HeightOfPrevMipsInTile = 1;
    uStack_c0 = 1;
    (**(code **)(*(long *)_SizeOfMip0 + 0x68))(_SizeOfMip0,&HeightOfPrevMipsInTile);
    auStack_90[10] = iVar7 << 0x12;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              (local_48,"SizeOfMip0","OffsetInfo.Render.Offset64",auStack_90 + 10,&local_98);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x412,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.XOffset",(int *)&gtest_ar.message_,auStack_90);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x413,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.YOffset",(int *)&gtest_ar.message_,auStack_90 + 1);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x414,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.ZOffset",(int *)&gtest_ar.message_,auStack_90 + 2);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x415,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_b8 = 0;
    uStack_b0 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    auStack_90[0] = 0;
    auStack_90[1] = 0;
    auStack_90[2] = 0;
    auStack_90[3] = 0;
    auStack_90[4] = 0;
    auStack_90[5] = 0;
    auStack_90[6] = 0;
    auStack_90[7] = 0;
    auStack_90[8] = 0;
    auStack_90[9] = 0;
    _HeightOfPrevMipsInTile = 1;
    uStack_c0 = 2;
    (**(code **)(*(long *)_SizeOfMip0 + 0x68))(_SizeOfMip0,&HeightOfPrevMipsInTile);
    local_54 = iVar7 * 0x2000 + auStack_90[10];
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              (local_48,"MipOffset","OffsetInfo.Render.Offset64",&local_54,&local_98);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x41e,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.XOffset",(int *)&gtest_ar.message_,auStack_90);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x41f,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.YOffset",(int *)&gtest_ar.message_,auStack_90 + 1);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x420,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.ZOffset",(int *)&gtest_ar.message_,auStack_90 + 2);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x421,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_64 = iVar7 << 9;
    uVar8 = 3;
    iVar7 = 0x200;
    do {
      auStack_90[6] = 0;
      auStack_90[7] = 0;
      auStack_90[8] = 0;
      auStack_90[9] = 0;
      auStack_90[2] = 0;
      auStack_90[3] = 0;
      auStack_90[4] = 0;
      auStack_90[5] = 0;
      local_98 = 0;
      auStack_90[0] = 0;
      auStack_90[1] = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      _HeightOfPrevMipsInTile = 1;
      uStack_c0 = (ulong)uVar8;
      (**(code **)(*(long *)_SizeOfMip0 + 0x68))(_SizeOfMip0,&HeightOfPrevMipsInTile);
      uVar6 = 0x200 >> ((char)uVar8 - 1U & 0x1f);
      local_54 = local_54 + uVar6 * local_64;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_48,"MipOffset","OffsetInfo.Render.Offset64",&local_54,&local_98);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x42e,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_
                                          ) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.XOffset",(int *)&gtest_ar.message_,auStack_90);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x430,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_
                                          ) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.YOffset",(int *)&gtest_ar.message_,auStack_90 + 1);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x431,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_
                                          ) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.ZOffset",(int *)&gtest_ar.message_,auStack_90 + 2);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x432,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_
                                          ) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      iVar7 = iVar7 + uVar6;
      uVar8 = uVar8 + 1;
    } while (uVar8 != 6);
    local_d0 = 0;
    uVar8 = 6;
    do {
      auStack_90[6] = 0;
      auStack_90[7] = 0;
      auStack_90[8] = 0;
      auStack_90[9] = 0;
      auStack_90[2] = 0;
      auStack_90[3] = 0;
      auStack_90[4] = 0;
      auStack_90[5] = 0;
      local_98 = 0;
      auStack_90[0] = 0;
      auStack_90[1] = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      _HeightOfPrevMipsInTile = 1;
      uStack_c0 = (ulong)uVar8;
      (**(code **)(*(long *)_SizeOfMip0 + 0x68))(_SizeOfMip0,&HeightOfPrevMipsInTile);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_48,"MipOffset","OffsetInfo.Render.Offset64",&local_54,&local_98);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x43f,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_
                                          ) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.XOffset",(int *)&gtest_ar.message_,auStack_90);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x442,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_
                                          ) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_d0 = local_d0 + (0x200U >> ((char)uVar8 - 1U & 0x1f));
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_48,"HeightOfPrevMipsInTile","OffsetInfo.Render.YOffset",&local_d0,
                 auStack_90 + 1);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x444,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_
                                          ) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar.message_.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_48,"0","OffsetInfo.Render.ZOffset",(int *)&gtest_ar.message_,auStack_90 + 2);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar5 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar5 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                   ,0x445,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
              (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_
                                          ) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 9);
    auStack_90[6] = 0;
    auStack_90[7] = 0;
    auStack_90[8] = 0;
    auStack_90[9] = 0;
    auStack_90[2] = 0;
    auStack_90[3] = 0;
    auStack_90[4] = 0;
    auStack_90[5] = 0;
    local_98 = 0;
    auStack_90[0] = 0;
    auStack_90[1] = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    _HeightOfPrevMipsInTile = 1;
    uStack_c0 = 9;
    (**(code **)(*(long *)_SizeOfMip0 + 0x68))(_SizeOfMip0,&HeightOfPrevMipsInTile);
    local_54 = local_54 + local_cc * 0x4000;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              (local_48,"MipOffset","OffsetInfo.Render.Offset64",&local_54,&local_98);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x450,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.XOffset",(int *)&gtest_ar.message_,auStack_90);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x451,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.YOffset",(int *)&gtest_ar.message_,auStack_90 + 1);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x452,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.ZOffset",(int *)&gtest_ar.message_,auStack_90 + 2);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x453,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&gtest_ar.message_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pGVar4 = _SizeOfMip0;
    ExpectedValue = local_64;
    CTestResource::VerifyResourceSize<true>
              (&this->super_CTestResource,_SizeOfMip0,(ulong)((iVar7 + 0x40) * local_64));
    CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,pGVar4,ExpectedValue);
    CTestResource::VerifyResourcePitchInTiles<true>(&this->super_CTestResource,pGVar4,local_cc << 2)
    ;
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
    uVar8 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar8;
  } while (uVar8 != 5);
  pGVar4 = (GMM_RESOURCE_INFO *)0x0;
  this_00 = &gtest_ar.message_;
  do {
    gmmParams.MaximumRenamingListLength = 0;
    gmmParams.NoGfxMemory = '\0';
    gmmParams._109_3_ = 0;
    gmmParams.RotateInfo = 0;
    gmmParams._84_4_ = 0;
    gmmParams.pExistingSysMem = 0;
    gmmParams.MaxLod = 0;
    gmmParams.ArraySize = 0;
    gmmParams.BaseAlignment = 0;
    gmmParams.OverridePitch = 0;
    gmmParams.MSAA.NumSamples = 0;
    gmmParams.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
    gmmParams.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
    gmmParams.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
    gmmParams.MSAA.SamplePattern = GMM_MSAA_DISABLED;
    gmmParams.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
    gmmParams.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x1000000000;
    gmmParams.ExistingSysMemSize = 0x100000000;
    gmmParams.Type = RESOURCE_INVALID;
    gmmParams.Format = GMM_FORMAT_A4P4_UNORM_PALETTE1;
    gmmParams.CpTag = 4;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth64 = 2;
    gmmParams.BaseHeight = 2;
    gmmParams.Depth = 0;
    _uStack_168 = CONCAT44(*(undefined4 *)(pGVar4 + 0x1a8554),2);
    ResourceInfo = (GMM_RESOURCE_INFO *)
                   (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                             (CommonULT::pGmmULTClientContext,&uStack_168);
    uVar8 = (**(code **)(*(long *)ResourceInfo + 0x228))(ResourceInfo);
    iVar2 = (**(code **)(*(long *)ResourceInfo + 0x230))(ResourceInfo);
    local_64 = uVar8 + 1 & -uVar8;
    iVar3 = (-uVar8 & uVar8) + local_64;
    iVar7 = *(int *)(pGVar4 + 0x1a8560);
    uStack_c0 = 0;
    auStack_90[6] = 0;
    auStack_90[7] = 0;
    auStack_90[8] = 0;
    auStack_90[9] = 0;
    auStack_90[2] = 0;
    auStack_90[3] = 0;
    auStack_90[4] = 0;
    auStack_90[5] = 0;
    local_98 = 0;
    auStack_90[0] = 0;
    auStack_90[1] = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    _HeightOfPrevMipsInTile = 1;
    _SizeOfMip0 = pGVar4;
    (**(code **)(*(long *)ResourceInfo + 0x68))(ResourceInfo,&HeightOfPrevMipsInTile);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_48,"0","OffsetInfo.Render.Offset64",(int *)this_00,&local_98);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x486,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.XOffset",(int *)this_00,auStack_90);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x487,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.YOffset",(int *)this_00,auStack_90 + 1);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x488,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.ZOffset",(int *)this_00,auStack_90 + 2);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x489,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_b8 = 0;
    uStack_b0 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    auStack_90[0] = 0;
    auStack_90[1] = 0;
    auStack_90[2] = 0;
    auStack_90[3] = 0;
    auStack_90[4] = 0;
    auStack_90[5] = 0;
    auStack_90[6] = 0;
    auStack_90[7] = 0;
    auStack_90[8] = 0;
    auStack_90[9] = 0;
    _HeightOfPrevMipsInTile = 1;
    uStack_c0 = 1;
    (**(code **)(*(long *)ResourceInfo + 0x68))(ResourceInfo,&HeightOfPrevMipsInTile);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_48,"0","OffsetInfo.Render.Offset64",(int *)this_00,&local_98);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x490,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.XOffset",(int *)this_00,auStack_90);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x491,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar8 = -iVar2 & iVar2 + 1U;
    gtest_ar.message_.ptr_._0_4_ = uVar8;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_48,
               "(((ResourceHeight) + ((VAlign) - 1)) - (((ResourceHeight) + ((VAlign) - 1)) & ((VAlign) - 1)))"
               ,"OffsetInfo.Render.YOffset",(uint *)this_00,auStack_90 + 1);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x492,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.ZOffset",(int *)this_00,auStack_90 + 2);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x493,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_b8 = 0;
    uStack_b0 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    auStack_90[0] = 0;
    auStack_90[1] = 0;
    auStack_90[2] = 0;
    auStack_90[3] = 0;
    auStack_90[4] = 0;
    auStack_90[5] = 0;
    auStack_90[6] = 0;
    auStack_90[7] = 0;
    auStack_90[8] = 0;
    auStack_90[9] = 0;
    _HeightOfPrevMipsInTile = 1;
    uStack_c0 = 2;
    (**(code **)(*(long *)ResourceInfo + 0x68))(ResourceInfo,&HeightOfPrevMipsInTile);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_48,"0","OffsetInfo.Render.Offset64",(int *)this_00,&local_98);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x49a,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    auStack_90[10] = local_64 * *(int *)(_SizeOfMip0 + 0x1a8580);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_48,"Mip1Width","OffsetInfo.Render.XOffset",auStack_90 + 10,auStack_90);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x49c,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = uVar8;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_48,
               "(((ResourceHeight) + ((VAlign) - 1)) - (((ResourceHeight) + ((VAlign) - 1)) & ((VAlign) - 1)))"
               ,"OffsetInfo.Render.YOffset",(uint *)this_00,auStack_90 + 1);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x49d,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","OffsetInfo.Render.ZOffset",(int *)this_00,auStack_90 + 2);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      pcVar5 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0x49e,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_) !=
            (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(uint)gtest_ar.message_.ptr_)
                      + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar8 = iVar3 * iVar7 + 0x7f;
    CTestResource::VerifyResourceSize<true>(&this->super_CTestResource,ResourceInfo,0x1000);
    CTestResource::VerifyResourcePitch<true>
              (&this->super_CTestResource,ResourceInfo,uVar8 & 0xffffff80);
    CTestResource::VerifyResourcePitchInTiles<true>
              (&this->super_CTestResource,ResourceInfo,uVar8 >> 7);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,ResourceInfo);
    pGVar4 = _SizeOfMip0 + 4;
  } while ((int)pGVar4 != 0xc);
  return;
}

Assistant:

TEST_F(CTestResource, Test2DTileYResourceMips)
{
    const uint32_t TileSize[2] = {128, 32};
    enum Coords
    {
        X = 0,
        Y = 1
    };

    // Test normal mip case
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        const uint32_t ResourceWidth  = 0x200;
        const uint32_t ResourceHeight = 0x200;
        const uint32_t MaxLod         = 0x9;


        TEST_BPP             bpp       = static_cast<TEST_BPP>(i);
        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Type                 = RESOURCE_2D;
        gmmParams.Flags.Info.TiledY    = 1;
        gmmParams.NoGfxMemory          = 1;
        gmmParams.Flags.Gpu.Texture    = 1;
        gmmParams.BaseWidth64          = ResourceWidth;
        gmmParams.BaseHeight           = ResourceHeight;
        gmmParams.MaxLod               = MaxLod;
        gmmParams.Format               = SetResourceFormat(bpp);

        // Create resource
        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        // Mip0 is the widest mip. So it will dictate the pitch of the whole surface
        const uint32_t Pitch            = ResourceWidth * GetBppValue(bpp);
        uint32_t       AllocationHeight = 0;

        // Mip0 should be at offset 0 and tile aligned
        GMM_REQ_OFFSET_INFO OffsetInfo = {};
        OffsetInfo.ReqRender           = 1;
        OffsetInfo.MipLevel            = 0; //Mip 0
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(0, OffsetInfo.Render.Offset64);
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(0, OffsetInfo.Render.YOffset);
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Mip1 should be after whole Mip0. Should still be tile aligned.
        OffsetInfo           = {};
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 1; // Mip 1
        ResourceInfo->GetOffset(OffsetInfo);
        uint32_t SizeOfMip0      = Pitch * ResourceHeight;
        uint32_t HeightOfPrevMip = AllocationHeight = ResourceHeight;
        EXPECT_EQ(SizeOfMip0, OffsetInfo.Render.Offset64);
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(0, OffsetInfo.Render.YOffset);
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Mip2 should be on the right of Mip1. Should still be tile aligned.
        OffsetInfo           = {};
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 2; // Mip 2
        ResourceInfo->GetOffset(OffsetInfo);
        // MipOffset = Mip1Offset + Mip1Width in tiles
        uint32_t MipOffset = SizeOfMip0 + ((Pitch >> 1) / TileSize[X]) * PAGE_SIZE;
        EXPECT_EQ(MipOffset, OffsetInfo.Render.Offset64);
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(0, OffsetInfo.Render.YOffset);
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Mips 3-5 should be on tile boundary
        for(int i = 3; i < 6; i++)
        {
            OffsetInfo           = {};
            OffsetInfo.ReqRender = 1;
            OffsetInfo.MipLevel  = i;
            ResourceInfo->GetOffset(OffsetInfo);

            HeightOfPrevMip = (ResourceHeight >> (i - 1));
            AllocationHeight += HeightOfPrevMip;
            MipOffset += Pitch * HeightOfPrevMip;
            EXPECT_EQ(MipOffset, OffsetInfo.Render.Offset64);
            // No X/Y/Z offset since mip is at tile boundary
            EXPECT_EQ(0, OffsetInfo.Render.XOffset);
            EXPECT_EQ(0, OffsetInfo.Render.YOffset);
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        // Mips 6-8 will share 1 tile
        AllocationHeight += TileSize[Y];
        uint32_t HeightOfPrevMipsInTile = 0;
        for(int i = 6; i < 9; i++)
        {
            OffsetInfo           = {};
            OffsetInfo.ReqRender = 1;
            OffsetInfo.MipLevel  = i;
            ResourceInfo->GetOffset(OffsetInfo);

            EXPECT_EQ(MipOffset, OffsetInfo.Render.Offset64); // Same as previous tile aligned mip offset

            // X is 0, but Y offset will change
            EXPECT_EQ(0, OffsetInfo.Render.XOffset);
            HeightOfPrevMipsInTile += (ResourceHeight >> (i - 1));
            EXPECT_EQ(HeightOfPrevMipsInTile, OffsetInfo.Render.YOffset);
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        // Mip 9 is back on tile boundary
        OffsetInfo           = {};
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 9; // Mip 9
        ResourceInfo->GetOffset(OffsetInfo);

        MipOffset += Pitch * TileSize[Y];
        AllocationHeight += TileSize[Y];
        EXPECT_EQ(MipOffset, OffsetInfo.Render.Offset64);
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(0, OffsetInfo.Render.YOffset);
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Verify ResourceSize and Pitch
        VerifyResourceSize<true>(ResourceInfo, AllocationHeight * Pitch);
        VerifyResourcePitch<true>(ResourceInfo, Pitch);
        VerifyResourcePitchInTiles<true>(ResourceInfo, Pitch / TileSize[X]);
        // These are verified elsewhere
        VerifyResourceHAlign<false>(ResourceInfo, 0);
        VerifyResourceVAlign<false>(ResourceInfo, 0);
        VerifyResourceQPitch<false>(ResourceInfo, 0);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }


    // Test where Mip1 + Mip2 width > Mip0 width, and where everything fits in 1 tile
    for(uint32_t i = 0; i < TEST_BPP_64; i++)
    {
        const uint32_t ResourceWidth  = 0x4;
        const uint32_t ResourceHeight = 0x2;
        const uint32_t MaxLod         = 0x2;

        TEST_BPP             bpp       = static_cast<TEST_BPP>(i);
        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Type                 = RESOURCE_2D;
        gmmParams.Flags.Info.TiledY    = 1;
        gmmParams.NoGfxMemory          = 1;
        gmmParams.Flags.Gpu.Texture    = 1;
        gmmParams.BaseWidth64          = ResourceWidth;
        gmmParams.BaseHeight           = ResourceHeight;
        gmmParams.MaxLod               = MaxLod;
        gmmParams.Format               = SetResourceFormat(bpp);

        // Create resource
        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        // Get Alignment that GmmLib is using
        const uint32_t HAlign = ResourceInfo->GetHAlign();
        const uint32_t VAlign = ResourceInfo->GetVAlign();

        // Mip1 + Mip2 is the widest width. So it will dictate the pitch of the whole surface
        uint32_t Pitch = GetBppValue(bpp) *
                         (GMM_ULT_ALIGN(ResourceWidth >> 1, HAlign) + GMM_ULT_ALIGN(ResourceWidth >> 2, HAlign));
        Pitch = GMM_ULT_ALIGN(Pitch, TileSize[X]);

        // Mip0 should be at offset 0 and tile aligned
        GMM_REQ_OFFSET_INFO OffsetInfo = {};
        OffsetInfo.ReqRender           = 1;
        OffsetInfo.MipLevel            = 0; //Mip 0
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(0, OffsetInfo.Render.Offset64);
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(0, OffsetInfo.Render.YOffset);
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Mip1 should be after whole Mip0. Not tile aligned
        OffsetInfo           = {};
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 1; // Mip 1
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(0, OffsetInfo.Render.Offset64); // Same tile as Mip0
        EXPECT_EQ(0, OffsetInfo.Render.XOffset);
        EXPECT_EQ(GMM_ULT_ALIGN(ResourceHeight, VAlign), OffsetInfo.Render.YOffset); // After Mip0
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Mip2 should be on the right of Mip1. Not tile aligned
        OffsetInfo           = {};
        OffsetInfo.ReqRender = 1;
        OffsetInfo.MipLevel  = 2; // Mip 2
        ResourceInfo->GetOffset(OffsetInfo);
        EXPECT_EQ(0, OffsetInfo.Render.Offset64); // Same Tile as Mip0
        uint32_t Mip1Width = GMM_ULT_ALIGN(ResourceWidth >> 1, HAlign) * GetBppValue(bpp);
        EXPECT_EQ(Mip1Width, OffsetInfo.Render.XOffset);                             // On right of Mip1
        EXPECT_EQ(GMM_ULT_ALIGN(ResourceHeight, VAlign), OffsetInfo.Render.YOffset); // After Mip0
        EXPECT_EQ(0, OffsetInfo.Render.ZOffset);

        // Verify ResourceSize and Pitch
        VerifyResourceSize<true>(ResourceInfo, PAGE_SIZE); // everything should fit in 1 tile
        VerifyResourcePitch<true>(ResourceInfo, Pitch);
        VerifyResourcePitchInTiles<true>(ResourceInfo, Pitch / TileSize[X]);
        // These are verified elsewhere
        VerifyResourceHAlign<false>(ResourceInfo, 0);
        VerifyResourceVAlign<false>(ResourceInfo, 0);
        VerifyResourceQPitch<false>(ResourceInfo, 0);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}